

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::Datum::InternalSerializeWithCachedSizesToArray(Datum *this,bool deterministic,uint8 *target)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  string *str;
  void *pvVar4;
  bool bVar5;
  byte *pbVar6;
  LogMessage *other;
  Rep *pRVar7;
  ulong uVar8;
  ulong uVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 2) != 0) {
    uVar8 = (ulong)this->channels_;
    pbVar6 = target + 1;
    *target = '\b';
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar5 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar5);
    }
    *pbVar6 = (byte)uVar9;
    target = pbVar6 + 1;
  }
  if ((uVar2 & 4) != 0) {
    uVar8 = (ulong)this->height_;
    pbVar6 = target + 1;
    *target = 0x10;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar5 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar5);
    }
    *pbVar6 = (byte)uVar9;
    target = pbVar6 + 1;
  }
  if ((uVar2 & 8) != 0) {
    uVar8 = (ulong)this->width_;
    pbVar6 = target + 1;
    *target = 0x18;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar5 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar5);
    }
    *pbVar6 = (byte)uVar9;
    target = pbVar6 + 1;
  }
  if ((uVar2 & 1) != 0) {
    str = (this->data_).ptr_;
    *target = 0x22;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(str,target + 1);
  }
  if ((uVar2 & 0x10) != 0) {
    uVar8 = (ulong)this->label_;
    pbVar6 = target + 1;
    *target = 0x28;
    uVar9 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar5 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar5);
    }
    *pbVar6 = (byte)uVar9;
    target = pbVar6 + 1;
  }
  uVar3 = (this->float_data_).current_size_;
  if (uVar3 != 0) {
    pRVar7 = (this->float_data_).rep_;
    if (pRVar7 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      other = google::protobuf::internal::LogMessage::operator<<(&local_60,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
      pRVar7 = (this->float_data_).rep_;
    }
    uVar8 = 1;
    if (1 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    uVar9 = 0;
    do {
      fVar1 = pRVar7->elements[uVar9];
      *target = 0x35;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  if ((uVar2 & 0x20) != 0) {
    bVar5 = this->encoded_;
    *target = 0x38;
    target[1] = bVar5;
    target = target + 2;
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* Datum::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.Datum)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 channels = 1;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->channels(), target);
  }

  // optional int32 height = 2;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->height(), target);
  }

  // optional int32 width = 3;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->width(), target);
  }

  // optional bytes data = 4;
  if (cached_has_bits & 0x00000001u) {
    target =
      ::google::protobuf::internal::WireFormatLite::WriteBytesToArray(
        4, this->data(), target);
  }

  // optional int32 label = 5;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(5, this->label(), target);
  }

  // repeated float float_data = 6;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(6, this->float_data_, target);

  // optional bool encoded = 7 [default = false];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->encoded(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.Datum)
  return target;
}